

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O3

void Diffusion::computeExtensiveFluxes
               (MLMG *a_mg,MultiFab *Soln,MultiFab **flux,int fluxComp,int ncomp,MultiFab *area,
               Real fac)

{
  EBCellFlagFab *this;
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  FabType FVar4;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  initializer_list<std::array<amrex::MultiFab_*,_3UL>_> __l;
  initializer_list<amrex::MultiFab_*> __l_00;
  Box wbx;
  Box vbx;
  Box ubx;
  Box result;
  MFIter mfi;
  Box bx;
  MultiFab flxz;
  MultiFab flxy;
  MultiFab flxx;
  long local_880;
  long local_870;
  long local_850;
  Box local_81c;
  Box local_800;
  Box local_7e4;
  FabArrayBase *local_7c8;
  Array4<double> local_7c0;
  Real local_780;
  FabArray<amrex::FArrayBox> *local_778;
  Array4<double> local_770;
  Array4<double> local_730;
  MultiCutFab *local_6f0;
  MultiCutFab *local_6e8;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> local_6e0;
  FabArray<amrex::FArrayBox> *local_6d8;
  FabArray<amrex::FArrayBox> *local_6d0;
  Array4<double> local_6c8;
  Array4<double> local_688;
  Array4<double> local_648;
  undefined1 local_608 [32];
  int local_5e8;
  int local_5e4;
  int local_5e0;
  undefined1 local_5c8 [32];
  int local_5a8 [2];
  int local_5a0;
  Vector<int,_std::allocator<int>_> *local_588;
  double *local_564;
  int iStack_55c;
  int iStack_558;
  int iStack_554;
  undefined8 uStack_550;
  Array4<const_double> local_548;
  Array4<const_double> local_508;
  MFItInfo local_4c4;
  FabArray<amrex::FArrayBox> local_4b0;
  FabArray<amrex::FArrayBox> local_330;
  FabArray<amrex::FArrayBox> local_1b0;
  
  uVar1 = (ulong)(uint)ncomp;
  local_7c8 = (FabArrayBase *)Soln;
  local_780 = fac;
  local_778 = &area->super_FabArray<amrex::FArrayBox>;
  amrex::MultiFab::MultiFab((MultiFab *)&local_1b0,*flux,make_alias,fluxComp,ncomp);
  amrex::MultiFab::MultiFab((MultiFab *)&local_330,flux[1],make_alias,fluxComp,ncomp);
  amrex::MultiFab::MultiFab((MultiFab *)&local_4b0,flux[2],make_alias,fluxComp,ncomp);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_730;
  local_730.p = (double *)&local_1b0;
  local_730.jstride = (Long)&local_330;
  local_730.kstride = (Long)&local_4b0;
  std::
  vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>::
  vector((vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *)local_5c8,__l,(allocator_type *)&local_688);
  local_770.p = (double *)local_7c8;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_770;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_7c0,__l_00,
             (allocator_type *)&local_6c8);
  amrex::MLMG::getFluxes
            (a_mg,(Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                   *)local_5c8,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_7c0,
             FaceCentroid);
  if (local_7c0.p != (double *)0x0) {
    operator_delete(local_7c0.p,local_7c0.kstride - (long)local_7c0.p);
  }
  if ((FabArrayBase *)local_5c8._0_8_ != (FabArrayBase *)0x0) {
    operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ - local_5c8._0_8_);
  }
  lVar5 = __dynamic_cast((((__uniq_ptr_data<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>,_true,_true>
                            *)&local_7c8[1]._vptr_FabArrayBase)->
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         )._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                         &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (lVar5 == 0) {
    __cxa_bad_cast();
  }
  amrex::EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar5 + 0xd8));
  local_6e0._M_head_impl = (FabArrayBase *)local_5c8._0_8_;
  local_6e8 = (MultiCutFab *)local_5c8._8_8_;
  local_6f0 = (MultiCutFab *)local_5c8._16_8_;
  local_4c4.num_streams = amrex::Gpu::Device::max_gpu_streams;
  local_4c4.do_tiling = true;
  local_4c4.tilesize.vect[0] = (int)amrex::FabArrayBase::mfiter_tile_size;
  local_4c4.tilesize.vect[1] = amrex::FabArrayBase::mfiter_tile_size._4_4_;
  local_4c4.tilesize.vect[2] = DAT_00717ec0;
  local_4c4.dynamic = true;
  local_4c4.device_sync = true;
  amrex::MFIter::MFIter((MFIter *)local_5c8,local_7c8,&local_4c4);
  if (local_5a8[0] < local_5a0) {
    local_6d0 = local_778 + 1;
    local_6d8 = local_778 + 2;
    do {
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_730,&local_1b0,(MFIter *)local_5c8);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_7c0,&local_330,(MFIter *)local_5c8);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_770,&local_4b0,(MFIter *)local_5c8);
      amrex::MFIter::nodaltilebox(&local_7e4,(MFIter *)local_5c8,0);
      amrex::MFIter::nodaltilebox(&local_800,(MFIter *)local_5c8,1);
      amrex::MFIter::nodaltilebox(&local_81c,(MFIter *)local_5c8,2);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_688,local_778,(MFIter *)local_5c8);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_6c8,local_6d0,(MFIter *)local_5c8);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_648,local_6d8,(MFIter *)local_5c8);
      amrex::MFIter::tilebox((Box *)&local_564,(MFIter *)local_5c8);
      piVar6 = local_5a8;
      if (local_588 != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar6 = (local_588->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + local_5a8[0];
      }
      this = *(EBCellFlagFab **)
              (*(long *)(*(long *)((long)&local_7c8[1].boxarray.m_bat.m_op + 0xc) +
                        (long)*piVar6 * 8) + 0x48);
      local_608._20_4_ = (undefined4)uStack_550;
      local_608._24_4_ = SUB84(uStack_550,4);
      local_608._0_8_ = local_564;
      FVar4 = amrex::EBCellFlagFab::getType(this,(Box *)local_608);
      auVar3 = _DAT_0065b9b0;
      auVar2 = _DAT_0065b9a0;
      if (FVar4 == covered) {
        if (0 < ncomp) {
          uVar12 = local_7e4.bigend.vect[0] - local_7e4.smallend.vect[0];
          auVar22._4_4_ = 0;
          auVar22._0_4_ = uVar12;
          auVar22._8_4_ = uVar12;
          auVar22._12_4_ = 0;
          local_880 = 0;
          uVar7 = 0;
          do {
            iVar10 = local_7e4.smallend.vect[2];
            if (local_7e4.smallend.vect[2] <= local_7e4.bigend.vect[2]) {
              do {
                if (local_7e4.smallend.vect[1] <= local_7e4.bigend.vect[1]) {
                  lVar8 = (long)local_730.p +
                          local_730.nstride * local_880 +
                          ((long)local_7e4.smallend.vect[1] - (long)local_730.begin.y) *
                          local_730.jstride * 8 +
                          ((long)iVar10 - (long)local_730.begin.z) * local_730.kstride * 8 +
                          (long)local_730.begin.x * -8 + (long)local_7e4.smallend.vect[0] * 8 + 8;
                  lVar5 = (long)local_7e4.smallend.vect[1];
                  do {
                    if (local_7e4.smallend.vect[0] <= local_7e4.bigend.vect[0]) {
                      uVar16 = 0;
                      do {
                        auVar20._8_4_ = (int)uVar16;
                        auVar20._0_8_ = uVar16;
                        auVar20._12_4_ = (int)(uVar16 >> 0x20);
                        auVar24 = auVar22 ^ auVar3;
                        auVar20 = (auVar20 | auVar2) ^ auVar3;
                        if ((bool)(~(auVar20._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar20._0_4_
                                    || auVar24._4_4_ < auVar20._4_4_) & 1)) {
                          *(undefined8 *)(lVar8 + -8 + uVar16 * 8) = 0x483d6329f1c35ca5;
                        }
                        if (auVar20._12_4_ <= auVar24._12_4_ &&
                            (auVar20._12_4_ != auVar24._12_4_ || auVar20._8_4_ <= auVar24._8_4_)) {
                          *(undefined8 *)(lVar8 + uVar16 * 8) = 0x483d6329f1c35ca5;
                        }
                        uVar16 = uVar16 + 2;
                      } while (((ulong)uVar12 + 2 & 0x1fffffffe) != uVar16);
                    }
                    lVar5 = lVar5 + 1;
                    lVar8 = lVar8 + local_730.jstride * 8;
                  } while (local_7e4.bigend.vect[1] + 1 != (int)lVar5);
                }
                bVar18 = iVar10 != local_7e4.bigend.vect[2];
                iVar10 = iVar10 + 1;
              } while (bVar18);
            }
            uVar7 = uVar7 + 1;
            local_880 = local_880 + 8;
          } while (uVar7 != uVar1);
          if (0 < ncomp) {
            uVar12 = local_800.bigend.vect[0] - local_800.smallend.vect[0];
            auVar24._4_4_ = 0;
            auVar24._0_4_ = uVar12;
            auVar24._8_4_ = uVar12;
            auVar24._12_4_ = 0;
            auVar24 = auVar24 ^ auVar3;
            local_880 = 0;
            uVar7 = 0;
            do {
              iVar10 = local_800.smallend.vect[2];
              if (local_800.smallend.vect[2] <= local_800.bigend.vect[2]) {
                do {
                  if (local_800.smallend.vect[1] <= local_800.bigend.vect[1]) {
                    lVar8 = (long)local_7c0.p +
                            local_7c0.nstride * local_880 +
                            ((long)local_800.smallend.vect[1] - (long)local_7c0.begin.y) *
                            local_7c0.jstride * 8 +
                            ((long)iVar10 - (long)local_7c0.begin.z) * local_7c0.kstride * 8 +
                            (long)local_7c0.begin.x * -8 + (long)local_800.smallend.vect[0] * 8 + 8;
                    lVar5 = (long)local_800.smallend.vect[1];
                    do {
                      if (local_800.smallend.vect[0] <= local_800.bigend.vect[0]) {
                        uVar16 = 0;
                        do {
                          auVar21._8_4_ = (int)uVar16;
                          auVar21._0_8_ = uVar16;
                          auVar21._12_4_ = (int)(uVar16 >> 0x20);
                          auVar22 = (auVar21 | auVar2) ^ auVar3;
                          if ((bool)(~(auVar24._4_4_ < auVar22._4_4_ ||
                                      auVar24._0_4_ < auVar22._0_4_ &&
                                      auVar22._4_4_ == auVar24._4_4_) & 1)) {
                            *(undefined8 *)(lVar8 + -8 + uVar16 * 8) = 0x483d6329f1c35ca5;
                          }
                          if (auVar22._12_4_ <= auVar24._12_4_ &&
                              (auVar22._8_4_ <= auVar24._8_4_ || auVar22._12_4_ != auVar24._12_4_))
                          {
                            *(undefined8 *)(lVar8 + uVar16 * 8) = 0x483d6329f1c35ca5;
                          }
                          uVar16 = uVar16 + 2;
                        } while (((ulong)uVar12 + 2 & 0x1fffffffe) != uVar16);
                      }
                      lVar5 = lVar5 + 1;
                      lVar8 = lVar8 + local_7c0.jstride * 8;
                    } while (local_800.bigend.vect[1] + 1 != (int)lVar5);
                  }
                  bVar18 = iVar10 != local_800.bigend.vect[2];
                  iVar10 = iVar10 + 1;
                } while (bVar18);
              }
              uVar7 = uVar7 + 1;
              local_880 = local_880 + 8;
            } while (uVar7 != uVar1);
            if (0 < ncomp) {
              uVar12 = local_81c.bigend.vect[0] - local_81c.smallend.vect[0];
              auVar19._4_4_ = 0;
              auVar19._0_4_ = uVar12;
              auVar19._8_4_ = uVar12;
              auVar19._12_4_ = 0;
              auVar19 = auVar19 ^ auVar3;
              local_880 = 0;
              uVar7 = 0;
              do {
                iVar10 = local_81c.smallend.vect[2];
                if (local_81c.smallend.vect[2] <= local_81c.bigend.vect[2]) {
                  do {
                    if (local_81c.smallend.vect[1] <= local_81c.bigend.vect[1]) {
                      lVar8 = (long)local_770.p +
                              local_770.nstride * local_880 +
                              ((long)local_81c.smallend.vect[1] - (long)local_770.begin.y) *
                              local_770.jstride * 8 +
                              ((long)iVar10 - (long)local_770.begin.z) * local_770.kstride * 8 +
                              (long)local_770.begin.x * -8 + (long)local_81c.smallend.vect[0] * 8 +
                              8;
                      lVar5 = (long)local_81c.smallend.vect[1];
                      do {
                        if (local_81c.smallend.vect[0] <= local_81c.bigend.vect[0]) {
                          uVar16 = 0;
                          do {
                            auVar23._8_4_ = (int)uVar16;
                            auVar23._0_8_ = uVar16;
                            auVar23._12_4_ = (int)(uVar16 >> 0x20);
                            auVar22 = (auVar23 | auVar2) ^ auVar3;
                            if ((bool)(~(auVar19._4_4_ < auVar22._4_4_ ||
                                        auVar19._0_4_ < auVar22._0_4_ &&
                                        auVar22._4_4_ == auVar19._4_4_) & 1)) {
                              *(undefined8 *)(lVar8 + -8 + uVar16 * 8) = 0x483d6329f1c35ca5;
                            }
                            if (auVar22._12_4_ <= auVar19._12_4_ &&
                                (auVar22._8_4_ <= auVar19._8_4_ || auVar22._12_4_ != auVar19._12_4_)
                               ) {
                              *(undefined8 *)(lVar8 + uVar16 * 8) = 0x483d6329f1c35ca5;
                            }
                            uVar16 = uVar16 + 2;
                          } while (((ulong)uVar12 + 2 & 0x1fffffffe) != uVar16);
                        }
                        lVar5 = lVar5 + 1;
                        lVar8 = lVar8 + local_770.jstride * 8;
                      } while (local_81c.bigend.vect[1] + 1 != (int)lVar5);
                    }
                    bVar18 = iVar10 != local_81c.bigend.vect[2];
                    iVar10 = iVar10 + 1;
                  } while (bVar18);
                }
                uVar7 = uVar7 + 1;
                local_880 = local_880 + 8;
              } while (uVar7 != uVar1);
            }
          }
        }
      }
      else {
        local_608._16_4_ = iStack_554;
        local_608._20_4_ = (undefined4)uStack_550;
        local_608._24_4_ = SUB84(uStack_550,4);
        local_608._0_8_ = local_564;
        local_608._8_4_ = iStack_55c;
        local_608._12_4_ = iStack_558;
        FVar4 = amrex::EBCellFlagFab::getType(this,(Box *)local_608);
        if (FVar4 == regular) {
          if (0 < ncomp) {
            lVar5 = (long)local_7e4.smallend.vect[1];
            local_850 = 0;
            uVar7 = 0;
            do {
              iVar10 = local_7e4.smallend.vect[2];
              if (local_7e4.smallend.vect[2] <= local_7e4.bigend.vect[2]) {
                do {
                  if (local_7e4.smallend.vect[1] <= local_7e4.bigend.vect[1]) {
                    lVar14 = (long)local_730.p +
                             local_730.nstride * local_850 +
                             (lVar5 - local_730.begin.y) * local_730.jstride * 8 +
                             ((long)iVar10 - (long)local_730.begin.z) * local_730.kstride * 8 +
                             (long)local_730.begin.x * -8 + (long)local_7e4.smallend.vect[0] * 8;
                    lVar9 = (long)local_688.p +
                            (lVar5 - local_688.begin.y) * local_688.jstride * 8 +
                            ((long)iVar10 - (long)local_688.begin.z) * local_688.kstride * 8 +
                            (long)local_688.begin.x * -8 + (long)local_7e4.smallend.vect[0] * 8;
                    lVar8 = lVar5;
                    do {
                      if (local_7e4.smallend.vect[0] <= local_7e4.bigend.vect[0]) {
                        lVar11 = 0;
                        do {
                          *(double *)(lVar14 + lVar11 * 8) =
                               *(double *)(lVar9 + lVar11 * 8) * local_780 *
                               *(double *)(lVar14 + lVar11 * 8);
                          lVar11 = lVar11 + 1;
                        } while ((local_7e4.bigend.vect[0] - local_7e4.smallend.vect[0]) + 1 !=
                                 (int)lVar11);
                      }
                      lVar8 = lVar8 + 1;
                      lVar14 = lVar14 + local_730.jstride * 8;
                      lVar9 = lVar9 + local_688.jstride * 8;
                    } while (local_7e4.bigend.vect[1] + 1 != (int)lVar8);
                  }
                  bVar18 = iVar10 != local_7e4.bigend.vect[2];
                  iVar10 = iVar10 + 1;
                } while (bVar18);
              }
              uVar7 = uVar7 + 1;
              local_850 = local_850 + 8;
            } while (uVar7 != uVar1);
            if (0 < ncomp) {
              lVar5 = (long)local_800.smallend.vect[1];
              local_850 = 0;
              uVar7 = 0;
              do {
                iVar10 = local_800.smallend.vect[2];
                if (local_800.smallend.vect[2] <= local_800.bigend.vect[2]) {
                  do {
                    if (local_800.smallend.vect[1] <= local_800.bigend.vect[1]) {
                      lVar14 = (long)local_7c0.p +
                               local_7c0.nstride * local_850 +
                               (lVar5 - local_7c0.begin.y) * local_7c0.jstride * 8 +
                               ((long)iVar10 - (long)local_7c0.begin.z) * local_7c0.kstride * 8 +
                               (long)local_7c0.begin.x * -8 + (long)local_800.smallend.vect[0] * 8;
                      lVar9 = (long)local_6c8.p +
                              (lVar5 - local_6c8.begin.y) * local_6c8.jstride * 8 +
                              ((long)iVar10 - (long)local_6c8.begin.z) * local_6c8.kstride * 8 +
                              (long)local_6c8.begin.x * -8 + (long)local_800.smallend.vect[0] * 8;
                      lVar8 = lVar5;
                      do {
                        if (local_800.smallend.vect[0] <= local_800.bigend.vect[0]) {
                          lVar11 = 0;
                          do {
                            *(double *)(lVar14 + lVar11 * 8) =
                                 *(double *)(lVar9 + lVar11 * 8) * local_780 *
                                 *(double *)(lVar14 + lVar11 * 8);
                            lVar11 = lVar11 + 1;
                          } while ((local_800.bigend.vect[0] - local_800.smallend.vect[0]) + 1 !=
                                   (int)lVar11);
                        }
                        lVar8 = lVar8 + 1;
                        lVar14 = lVar14 + local_7c0.jstride * 8;
                        lVar9 = lVar9 + local_6c8.jstride * 8;
                      } while (local_800.bigend.vect[1] + 1 != (int)lVar8);
                    }
                    bVar18 = iVar10 != local_800.bigend.vect[2];
                    iVar10 = iVar10 + 1;
                  } while (bVar18);
                }
                uVar7 = uVar7 + 1;
                local_850 = local_850 + 8;
              } while (uVar7 != uVar1);
              if (0 < ncomp) {
                lVar5 = (long)local_81c.smallend.vect[1];
                local_850 = 0;
                uVar7 = 0;
                do {
                  iVar10 = local_81c.smallend.vect[2];
                  if (local_81c.smallend.vect[2] <= local_81c.bigend.vect[2]) {
                    do {
                      if (local_81c.smallend.vect[1] <= local_81c.bigend.vect[1]) {
                        lVar14 = (long)local_770.p +
                                 local_770.nstride * local_850 +
                                 (lVar5 - local_770.begin.y) * local_770.jstride * 8 +
                                 ((long)iVar10 - (long)local_770.begin.z) * local_770.kstride * 8 +
                                 (long)local_770.begin.x * -8 + (long)local_81c.smallend.vect[0] * 8
                        ;
                        lVar9 = (long)local_648.p +
                                (lVar5 - local_648.begin.y) * local_648.jstride * 8 +
                                ((long)iVar10 - (long)local_648.begin.z) * local_648.kstride * 8 +
                                (long)local_648.begin.x * -8 + (long)local_81c.smallend.vect[0] * 8;
                        lVar8 = lVar5;
                        do {
                          if (local_81c.smallend.vect[0] <= local_81c.bigend.vect[0]) {
                            lVar11 = 0;
                            do {
                              *(double *)(lVar14 + lVar11 * 8) =
                                   *(double *)(lVar9 + lVar11 * 8) * local_780 *
                                   *(double *)(lVar14 + lVar11 * 8);
                              lVar11 = lVar11 + 1;
                            } while ((local_81c.bigend.vect[0] - local_81c.smallend.vect[0]) + 1 !=
                                     (int)lVar11);
                          }
                          lVar8 = lVar8 + 1;
                          lVar14 = lVar14 + local_770.jstride * 8;
                          lVar9 = lVar9 + local_648.jstride * 8;
                        } while (local_81c.bigend.vect[1] + 1 != (int)lVar8);
                      }
                      bVar18 = iVar10 != local_81c.bigend.vect[2];
                      iVar10 = iVar10 + 1;
                    } while (bVar18);
                  }
                  uVar7 = uVar7 + 1;
                  local_850 = local_850 + 8;
                } while (uVar7 != uVar1);
              }
            }
          }
        }
        else {
          amrex::MultiCutFab::array
                    ((Array4<const_double> *)local_608,(MultiCutFab *)local_6e0._M_head_impl,
                     (MFIter *)local_5c8);
          amrex::MultiCutFab::array(&local_508,local_6e8,(MFIter *)local_5c8);
          amrex::MultiCutFab::array(&local_548,local_6f0,(MFIter *)local_5c8);
          if (0 < ncomp) {
            lVar8 = (long)local_7e4.smallend.vect[1];
            lVar5 = (long)local_7e4.smallend.vect[0] * 8;
            local_870 = 0;
            uVar7 = 0;
            do {
              iVar10 = local_7e4.smallend.vect[2];
              if (local_7e4.smallend.vect[2] <= local_7e4.bigend.vect[2]) {
                do {
                  if (local_7e4.smallend.vect[1] <= local_7e4.bigend.vect[1]) {
                    lVar14 = (long)iVar10;
                    lVar17 = (long)local_730.p +
                             local_730.nstride * local_870 +
                             (lVar8 - local_730.begin.y) * local_730.jstride * 8 +
                             (lVar14 - local_730.begin.z) * local_730.kstride * 8 +
                             (long)local_730.begin.x * -8 + lVar5;
                    lVar9 = (long)local_688.p +
                            (lVar8 - local_688.begin.y) * local_688.jstride * 8 +
                            (lVar14 - local_688.begin.z) * local_688.kstride * 8 +
                            (long)local_688.begin.x * -8 + lVar5;
                    lVar11 = CONCAT44(local_608._12_4_,local_608._8_4_) * 8;
                    lVar15 = local_608._0_8_ +
                             (lVar8 - local_5e4) * lVar11 +
                             (lVar14 - local_5e0) * CONCAT44(local_608._20_4_,local_608._16_4_) * 8
                             + (long)local_5e8 * -8 + lVar5;
                    lVar14 = lVar8;
                    do {
                      if (local_7e4.smallend.vect[0] <= local_7e4.bigend.vect[0]) {
                        lVar13 = 0;
                        do {
                          *(double *)(lVar17 + lVar13 * 8) =
                               *(double *)(lVar9 + lVar13 * 8) * local_780 *
                               *(double *)(lVar15 + lVar13 * 8) * *(double *)(lVar17 + lVar13 * 8);
                          lVar13 = lVar13 + 1;
                        } while ((local_7e4.bigend.vect[0] - local_7e4.smallend.vect[0]) + 1 !=
                                 (int)lVar13);
                      }
                      lVar14 = lVar14 + 1;
                      lVar17 = lVar17 + local_730.jstride * 8;
                      lVar9 = lVar9 + local_688.jstride * 8;
                      lVar15 = lVar15 + lVar11;
                    } while (local_7e4.bigend.vect[1] + 1 != (int)lVar14);
                  }
                  bVar18 = iVar10 != local_7e4.bigend.vect[2];
                  iVar10 = iVar10 + 1;
                } while (bVar18);
              }
              uVar7 = uVar7 + 1;
              local_870 = local_870 + 8;
            } while (uVar7 != uVar1);
            if (0 < ncomp) {
              lVar8 = (long)local_800.smallend.vect[1];
              lVar5 = (long)local_800.smallend.vect[0] * 8;
              local_870 = 0;
              uVar7 = 0;
              do {
                iVar10 = local_800.smallend.vect[2];
                if (local_800.smallend.vect[2] <= local_800.bigend.vect[2]) {
                  do {
                    if (local_800.smallend.vect[1] <= local_800.bigend.vect[1]) {
                      lVar14 = (long)iVar10;
                      lVar15 = (long)local_7c0.p +
                               local_7c0.nstride * local_870 +
                               (lVar8 - local_7c0.begin.y) * local_7c0.jstride * 8 +
                               (lVar14 - local_7c0.begin.z) * local_7c0.kstride * 8 +
                               (long)local_7c0.begin.x * -8 + lVar5;
                      lVar9 = (long)local_6c8.p +
                              (lVar8 - local_6c8.begin.y) * local_6c8.jstride * 8 +
                              (lVar14 - local_6c8.begin.z) * local_6c8.kstride * 8 +
                              (long)local_6c8.begin.x * -8 + lVar5;
                      lVar11 = (long)local_508.p +
                               (lVar8 - local_508.begin.y) * local_508.jstride * 8 +
                               (lVar14 - local_508.begin.z) * local_508.kstride * 8 +
                               (long)local_508.begin.x * -8 + lVar5;
                      lVar14 = lVar8;
                      do {
                        if (local_800.smallend.vect[0] <= local_800.bigend.vect[0]) {
                          lVar17 = 0;
                          do {
                            *(double *)(lVar15 + lVar17 * 8) =
                                 *(double *)(lVar9 + lVar17 * 8) * local_780 *
                                 *(double *)(lVar11 + lVar17 * 8) * *(double *)(lVar15 + lVar17 * 8)
                            ;
                            lVar17 = lVar17 + 1;
                          } while ((local_800.bigend.vect[0] - local_800.smallend.vect[0]) + 1 !=
                                   (int)lVar17);
                        }
                        lVar14 = lVar14 + 1;
                        lVar15 = lVar15 + local_7c0.jstride * 8;
                        lVar9 = lVar9 + local_6c8.jstride * 8;
                        lVar11 = lVar11 + local_508.jstride * 8;
                      } while (local_800.bigend.vect[1] + 1 != (int)lVar14);
                    }
                    bVar18 = iVar10 != local_800.bigend.vect[2];
                    iVar10 = iVar10 + 1;
                  } while (bVar18);
                }
                uVar7 = uVar7 + 1;
                local_870 = local_870 + 8;
              } while (uVar7 != uVar1);
              if (0 < ncomp) {
                lVar8 = (long)local_81c.smallend.vect[1];
                lVar5 = (long)local_81c.smallend.vect[0] * 8;
                local_870 = 0;
                uVar7 = 0;
                do {
                  iVar10 = local_81c.smallend.vect[2];
                  if (local_81c.smallend.vect[2] <= local_81c.bigend.vect[2]) {
                    do {
                      if (local_81c.smallend.vect[1] <= local_81c.bigend.vect[1]) {
                        lVar14 = (long)iVar10;
                        lVar15 = (long)local_770.p +
                                 local_770.nstride * local_870 +
                                 (lVar8 - local_770.begin.y) * local_770.jstride * 8 +
                                 (lVar14 - local_770.begin.z) * local_770.kstride * 8 +
                                 (long)local_770.begin.x * -8 + lVar5;
                        lVar9 = (long)local_648.p +
                                (lVar8 - local_648.begin.y) * local_648.jstride * 8 +
                                (lVar14 - local_648.begin.z) * local_648.kstride * 8 +
                                (long)local_648.begin.x * -8 + lVar5;
                        lVar11 = (long)local_548.p +
                                 (lVar8 - local_548.begin.y) * local_548.jstride * 8 +
                                 (lVar14 - local_548.begin.z) * local_548.kstride * 8 +
                                 (long)local_548.begin.x * -8 + lVar5;
                        lVar14 = lVar8;
                        do {
                          if (local_81c.smallend.vect[0] <= local_81c.bigend.vect[0]) {
                            lVar17 = 0;
                            do {
                              *(double *)(lVar15 + lVar17 * 8) =
                                   *(double *)(lVar9 + lVar17 * 8) * local_780 *
                                   *(double *)(lVar11 + lVar17 * 8) *
                                   *(double *)(lVar15 + lVar17 * 8);
                              lVar17 = lVar17 + 1;
                            } while ((local_81c.bigend.vect[0] - local_81c.smallend.vect[0]) + 1 !=
                                     (int)lVar17);
                          }
                          lVar14 = lVar14 + 1;
                          lVar15 = lVar15 + local_770.jstride * 8;
                          lVar9 = lVar9 + local_648.jstride * 8;
                          lVar11 = lVar11 + local_548.jstride * 8;
                        } while (local_81c.bigend.vect[1] + 1 != (int)lVar14);
                      }
                      bVar18 = iVar10 != local_81c.bigend.vect[2];
                      iVar10 = iVar10 + 1;
                    } while (bVar18);
                  }
                  uVar7 = uVar7 + 1;
                  local_870 = local_870 + 8;
                } while (uVar7 != uVar1);
              }
            }
          }
        }
      }
      amrex::MFIter::operator++((MFIter *)local_5c8);
    } while (local_5a8[0] < local_5a0);
  }
  amrex::MFIter::~MFIter((MFIter *)local_5c8);
  amrex::MultiFab::~MultiFab((MultiFab *)&local_4b0);
  amrex::MultiFab::~MultiFab((MultiFab *)&local_330);
  amrex::MultiFab::~MultiFab((MultiFab *)&local_1b0);
  return;
}

Assistant:

void
Diffusion::computeExtensiveFluxes(MLMG& a_mg, MultiFab& Soln,
                                  MultiFab* const* flux, const int fluxComp,
                                  const int ncomp, MultiFab* area,
                                  const Real fac )
{
   BL_ASSERT(flux[0]->nGrow()==0);

   AMREX_D_TERM(MultiFab flxx(*flux[0], amrex::make_alias, fluxComp, ncomp);,
                MultiFab flxy(*flux[1], amrex::make_alias, fluxComp, ncomp);,
                MultiFab flxz(*flux[2], amrex::make_alias, fluxComp, ncomp););
   std::array<MultiFab*,AMREX_SPACEDIM> fp{AMREX_D_DECL(&flxx,&flxy,&flxz)};

   a_mg.getFluxes({fp},{&Soln},MLLinOp::Location::FaceCentroid);

#ifdef AMREX_USE_EB
   auto const& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(Soln.Factory());
   Array< const MultiCutFab*,AMREX_SPACEDIM> areafrac;
   areafrac  = ebfactory.getAreaFrac();
#endif

   MFItInfo mfi_info;
   if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(Soln, mfi_info); mfi.isValid(); ++mfi)
   {
      D_TERM( const auto& fx = flxx.array(mfi);,
              const auto& fy = flxy.array(mfi);,
              const auto& fz = flxz.array(mfi););

      D_TERM( const Box ubx = mfi.nodaltilebox(0);,
              const Box vbx = mfi.nodaltilebox(1);,
              const Box wbx = mfi.nodaltilebox(2););

      D_TERM( const auto& areax = area[0].array(mfi);,
              const auto& areay = area[1].array(mfi);,
              const auto& areaz = area[2].array(mfi););

#ifdef AMREX_USE_EB
      Box bx = mfi.tilebox();

      const EBFArrayBox&     cc_fab = static_cast<EBFArrayBox const&>(Soln[mfi]);
      const EBCellFlagFab&    flags = cc_fab.getEBCellFlagFab();

      if ( flags.getType(amrex::grow(bx,0)) == FabType::covered )
      {
         //
         // For now, set to very large num so we know if you accidentally use it
         // MLMG will set covered fluxes to zero
         //
         D_TERM(AMREX_PARALLEL_FOR_4D(ubx, ncomp, i, j, k, n, {fx(i,j,k,n) = COVERED_VAL;});,
                AMREX_PARALLEL_FOR_4D(vbx, ncomp, i, j, k, n, {fy(i,j,k,n) = COVERED_VAL;});,
                AMREX_PARALLEL_FOR_4D(wbx, ncomp, i, j, k, n, {fz(i,j,k,n) = COVERED_VAL;}););
      }
      else if ( flags.getType(amrex::grow(bx,0)) != FabType::regular )
      {
	 D_TERM( const auto& afrac_x = areafrac[0]->array(mfi);,
		 const auto& afrac_y = areafrac[1]->array(mfi);,
		 const auto& afrac_z = areafrac[2]->array(mfi););

	 D_TERM(AMREX_PARALLEL_FOR_4D(ubx, ncomp, i, j, k, n, {fx(i,j,k,n) *= fac*areax(i,j,k)*afrac_x(i,j,k);});,
		AMREX_PARALLEL_FOR_4D(vbx, ncomp, i, j, k, n, {fy(i,j,k,n) *= fac*areay(i,j,k)*afrac_y(i,j,k);});,
                AMREX_PARALLEL_FOR_4D(wbx, ncomp, i, j, k, n, {fz(i,j,k,n) *= fac*areaz(i,j,k)*afrac_z(i,j,k);}););
      }
      else
#endif
      {
	D_TERM(AMREX_PARALLEL_FOR_4D(ubx, ncomp, i, j, k, n, {fx(i,j,k,n) *= fac*areax(i,j,k);});,
	       AMREX_PARALLEL_FOR_4D(vbx, ncomp, i, j, k, n, {fy(i,j,k,n) *= fac*areay(i,j,k);});,
	       AMREX_PARALLEL_FOR_4D(wbx, ncomp, i, j, k, n, {fz(i,j,k,n) *= fac*areaz(i,j,k);}););
      }
   }
}